

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fStencilTexturingTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::UploadTexCubeCase::iterate(UploadTexCubeCase *this)

{
  int *piVar1;
  RenderContext *context;
  code *pcVar2;
  long *plVar3;
  pointer pPVar4;
  pointer pcVar5;
  TestContext *testCtx;
  undefined8 uVar6;
  pointer pfVar7;
  bool bVar8;
  int i;
  int iVar9;
  deUint32 dVar10;
  GLenum err;
  undefined4 uVar11;
  int iVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ObjectTraits *pOVar13;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  TextureFormat TVar14;
  void *__dest;
  undefined4 extraout_var_03;
  TestError *this_00;
  long lVar15;
  char *description;
  int faceNdx_1;
  long lVar16;
  int iVar17;
  vector<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_> *pvVar18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar19;
  int faceNdx;
  long lVar20;
  PixelFormat local_558;
  long local_548;
  undefined2 local_540;
  undefined1 local_53e;
  deUint8 indices [6];
  undefined2 uStack_532;
  undefined4 auStack_530 [2];
  undefined8 local_528;
  undefined2 local_520;
  undefined1 local_51e;
  TextureFormat local_518;
  pointer local_510;
  ConstPixelBufferAccess srcLevel;
  size_type __dnew_1;
  int local_4b0;
  float positions [8];
  vector<float,_std::allocator<float>_> texCoord;
  Texture depthStencilTex;
  Renderbuffer colorBuf;
  Framebuffer fbo;
  VertexArrayBinding vertexArrays [2];
  undefined1 local_348 [32];
  TextureLevel result;
  ShaderProgram program;
  ConstPixelBufferAccess *local_1c0;
  ConstPixelBufferAccess *pCStack_1b8;
  ConstPixelBufferAccess *local_1b0;
  TextureCube texData;
  Functions *gl;
  
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar9 = (*context->_vptr_RenderContext[3])(context);
  gl = (Functions *)CONCAT44(extraout_var,iVar9);
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  iVar9 = (*context->_vptr_RenderContext[3])(context);
  pOVar13 = glu::objectTraits(OBJECTTYPE_FRAMEBUFFER);
  glu::ObjectWrapper::ObjectWrapper
            (&fbo.super_ObjectWrapper,(Functions *)CONCAT44(extraout_var_00,iVar9),pOVar13);
  iVar9 = (*context->_vptr_RenderContext[3])(context);
  pOVar13 = glu::objectTraits(OBJECTTYPE_RENDERBUFFER);
  glu::ObjectWrapper::ObjectWrapper
            (&colorBuf.super_ObjectWrapper,(Functions *)CONCAT44(extraout_var_01,iVar9),pOVar13);
  iVar9 = (*context->_vptr_RenderContext[3])();
  pOVar13 = glu::objectTraits(OBJECTTYPE_TEXTURE);
  glu::ObjectWrapper::ObjectWrapper
            (&depthStencilTex.super_ObjectWrapper,(Functions *)CONCAT44(extraout_var_02,iVar9),
             pOVar13);
  program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)glu::mapGLInternalFormat(this->m_format);
  tcu::TextureCube::TextureCube(&texData,(TextureFormat *)&program,0x40);
  program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x300000008;
  tcu::TextureLevel::TextureLevel(&result,(TextureFormat *)&program,0x80,0x80,1);
  checkDepthStencilFormatSupport((this->super_TestCase).m_context,this->m_format);
  iVar9 = 0;
  pvVar18 = texData.m_access;
  lVar20 = 0;
  do {
    tcu::TextureCube::allocLevel(&texData,(CubeFace)lVar20,0);
    tcu::clearStencil((pvVar18->
                      super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                      )._M_impl.super__Vector_impl_data._M_start,iVar9);
    lVar20 = lVar20 + 1;
    iVar9 = iVar9 + 0x2a;
    pvVar18 = pvVar18 + 1;
  } while (lVar20 != 6);
  program.m_shaders[0].super__Vector_base<glu::Shader_*,_std::allocator<glu::Shader_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xbfa66666bfc00000;
  vertexArrays[0].binding.type = 0x3fa66666;
  vertexArrays[0].binding._4_4_ = 0x3fb33333;
  glu::TextureTestUtil::computeQuadTexCoordCube
            (&texCoord,CUBEFACE_NEGATIVE_X,(Vec2 *)&program,(Vec2 *)vertexArrays);
  (*gl->bindTexture)(0x8513,depthStencilTex.super_ObjectWrapper.m_object);
  (*gl->texStorage2D)(0x8513,1,this->m_format,0x40,0x40);
  pvVar18 = texData.m_access;
  lVar20 = 0;
  do {
    dVar10 = glu::getGLCubeFace((CubeFace)lVar20);
    glu::texSubImage2D(context,dVar10,0,0,0,
                       &((pvVar18->
                         super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                         )._M_impl.super__Vector_impl_data._M_start)->super_ConstPixelBufferAccess);
    lVar20 = lVar20 + 1;
    pvVar18 = pvVar18 + 1;
  } while (lVar20 != 6);
  err = (*gl->getError)();
  glu::checkError(err,"Uploading texture data failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fStencilTexturingTests.cpp"
                  ,0x2b9);
  (*gl->bindRenderbuffer)(0x8d41,colorBuf.super_ObjectWrapper.m_object);
  (*gl->renderbufferStorage)(0x8d41,0x8058,0x80,0x80);
  (*gl->bindFramebuffer)(0x8d40,fbo.super_ObjectWrapper.m_object);
  (*gl->framebufferRenderbuffer)(0x8d40,0x8ce0,0x8d41,colorBuf.super_ObjectWrapper.m_object);
  checkFramebufferStatus(gl);
  pfVar7 = texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_348[0x10] = 0;
  local_348._17_8_ = 0;
  local_348._0_8_ = (pointer)0x0;
  local_348[8] = 0;
  local_348._9_7_ = 0;
  memset(vertexArrays,0,0xac);
  _indices = (TextureFormat)&local_528;
  positions[0] = 2.36819e-43;
  positions[1] = 0.0;
  TVar14 = (TextureFormat)std::__cxx11::string::_M_create((ulong *)indices,(ulong)positions);
  uVar6 = positions._0_8_;
  local_528._0_4_ = positions[0];
  local_528._4_4_ = positions[1];
  _indices = TVar14;
  memcpy((void *)TVar14,
         "#version 300 es\nin highp vec4 a_position;\nin highp vec3 a_texCoord;\nout highp vec3 v_texCoord;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_texCoord = a_texCoord;\n}\n"
         ,0xa9);
  *(undefined1 *)((long)TVar14 + uVar6) = 0;
  srcLevel.m_format = (TextureFormat)((ulong)srcLevel.m_format.type << 0x20);
  piVar1 = srcLevel.m_pitch.m_data + 1;
  srcLevel.m_size.m_data._0_8_ = piVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&srcLevel.m_size,_indices,uVar6 + (long)_indices);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(&vertexArrays[0].binding.type + ((ulong)srcLevel.m_format & 0xffffffff) * 6),
              (value_type *)&srcLevel.m_size);
  local_510 = pfVar7;
  local_558._0_8_ = &local_548;
  __dnew_1._0_4_ = 0xf4;
  __dnew_1._4_4_ = 0;
  __dest = (void *)std::__cxx11::string::_M_create((ulong *)&local_558,(ulong)&__dnew_1);
  iVar17 = __dnew_1._4_4_;
  iVar9 = (int)__dnew_1;
  local_558.redBits = (int)__dest;
  local_558.greenBits = (int)((ulong)__dest >> 0x20);
  lVar20 = CONCAT44(__dnew_1._4_4_,(int)__dnew_1);
  local_548 = lVar20;
  memcpy(__dest,
         "#version 300 es\nuniform highp usamplerCube u_sampler;\nin highp vec3 v_texCoord;\nlayout(location = 0) out highp vec4 o_color;\nvoid main (void)\n{\n\to_color.x = float(texture(u_sampler, v_texCoord).x) / 255.0;\n\to_color.yzw = vec3(0.0, 0.0, 1.0);\n}\n"
         ,0xf4);
  local_558.blueBits = iVar9;
  local_558.alphaBits = iVar17;
  *(undefined1 *)((long)__dest + lVar20) = 0;
  positions[0] = 1.4013e-45;
  positions._8_8_ = positions + 6;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(positions + 2),CONCAT44(local_558.greenBits,local_558.redBits),
             CONCAT44(iVar17,iVar9) + CONCAT44(local_558.greenBits,local_558.redBits));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(&vertexArrays[0].binding.type + (positions._0_8_ & 0xffffffff) * 6),
              (value_type *)(positions + 2));
  glu::ShaderProgram::ShaderProgram(&program,context,(ProgramSources *)vertexArrays);
  if ((float *)positions._8_8_ != positions + 6) {
    operator_delete((void *)positions._8_8_,positions._24_8_ + 1);
  }
  if ((long *)CONCAT44(local_558.greenBits,local_558.redBits) != &local_548) {
    operator_delete((long *)CONCAT44(local_558.greenBits,local_558.redBits),local_548 + 1);
  }
  if ((int *)srcLevel.m_size.m_data._0_8_ != piVar1) {
    operator_delete((void *)srcLevel.m_size.m_data._0_8_,
                    CONCAT17(srcLevel.m_pitch.m_data[2]._3_1_,
                             CONCAT16(srcLevel.m_pitch.m_data[2]._2_1_,
                                      CONCAT24((undefined2)srcLevel.m_pitch.m_data[2],
                                               srcLevel.m_pitch.m_data[1]))) + 1);
  }
  if (_indices != (TextureFormat)&local_528) {
    operator_delete((void *)_indices,local_528 + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_348);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            ((vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> *)
             &vertexArrays[1].pointer.stride);
  lVar20 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&vertexArrays[0].binding.type + lVar20));
    lVar20 = lVar20 + -0x18;
  } while (lVar20 != -0x18);
  positions[4] = 1.0;
  positions[5] = -1.0;
  positions._24_8_ = &DAT_3f8000003f800000;
  positions[0] = -1.0;
  positions[1] = -1.0;
  positions[2] = -1.0;
  positions[3] = 1.0;
  _indices = (TextureFormat)&local_528;
  local_528 = 0x697469736f705f61;
  local_520 = 0x6e6f;
  local_51e = 0;
  srcLevel.m_format.order = A;
  srcLevel.m_size.m_data._0_8_ = piVar1;
  std::__cxx11::string::_M_construct<char*>();
  vertexArrays[0].binding.type = srcLevel.m_format.order;
  vertexArrays[0].binding.name._M_dataplus._M_p = (pointer)&vertexArrays[0].binding.name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&vertexArrays[0].binding.name,srcLevel.m_size.m_data._0_8_,
             CONCAT26(srcLevel.m_pitch.m_data[0]._2_2_,srcLevel._16_6_) +
             srcLevel.m_size.m_data._0_8_);
  vertexArrays[0].binding.location = 0;
  vertexArrays[0].pointer.componentType = VTX_COMP_FLOAT;
  vertexArrays[0].pointer.convert = VTX_COMP_CONVERT_NONE;
  vertexArrays[0].pointer.numComponents = 2;
  vertexArrays[0].pointer.numElements = 4;
  vertexArrays[0].pointer.stride = 0;
  vertexArrays[0].pointer.data = positions;
  if ((int *)srcLevel.m_size.m_data._0_8_ != piVar1) {
    operator_delete((void *)srcLevel.m_size.m_data._0_8_,
                    CONCAT17(srcLevel.m_pitch.m_data[2]._3_1_,
                             CONCAT16(srcLevel.m_pitch.m_data[2]._2_1_,
                                      CONCAT24((undefined2)srcLevel.m_pitch.m_data[2],
                                               srcLevel.m_pitch.m_data[1]))) + 1);
  }
  local_558._0_8_ = &local_548;
  local_548 = 0x6f6f437865745f61;
  local_540 = 0x6472;
  local_558.blueBits = 10;
  local_558.alphaBits = 0;
  local_53e = 0;
  srcLevel.m_format.order = A;
  srcLevel.m_size.m_data._0_8_ = piVar1;
  std::__cxx11::string::_M_construct<char*>();
  vertexArrays[1].binding.type = srcLevel.m_format.order;
  paVar19 = &vertexArrays[1].binding.name.field_2;
  vertexArrays[1].binding.name._M_dataplus._M_p = (pointer)paVar19;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&vertexArrays[1].binding.name,srcLevel.m_size.m_data._0_8_,
             CONCAT26(srcLevel.m_pitch.m_data[0]._2_2_,srcLevel._16_6_) +
             srcLevel.m_size.m_data._0_8_);
  vertexArrays[1].binding.location = 0;
  vertexArrays[1].pointer.componentType = VTX_COMP_FLOAT;
  vertexArrays[1].pointer.convert = VTX_COMP_CONVERT_NONE;
  vertexArrays[1].pointer.numComponents = 3;
  vertexArrays[1].pointer.numElements = 4;
  vertexArrays[1].pointer.stride = 0;
  vertexArrays[1].pointer.data = local_510;
  if ((int *)srcLevel.m_size.m_data._0_8_ != piVar1) {
    operator_delete((void *)srcLevel.m_size.m_data._0_8_,
                    CONCAT17(srcLevel.m_pitch.m_data[2]._3_1_,
                             CONCAT16(srcLevel.m_pitch.m_data[2]._2_1_,
                                      CONCAT24((undefined2)srcLevel.m_pitch.m_data[2],
                                               srcLevel.m_pitch.m_data[1]))) + 1);
  }
  if ((long *)local_558._0_8_ != &local_548) {
    operator_delete((void *)local_558._0_8_,local_548 + 1);
  }
  if (_indices != (TextureFormat)&local_528) {
    operator_delete((void *)_indices,local_528 + 1);
  }
  indices[0] = '\0';
  indices[1] = '\0';
  indices[2] = '\0';
  indices[3] = '\0';
  indices[4] = '\x01';
  indices[5] = '\x03';
  indices[0] = '\0';
  indices[1] = '\x01';
  indices[2] = '\x02';
  indices[3] = '\x02';
  iVar9 = (*context->_vptr_RenderContext[3])(context);
  lVar20 = CONCAT44(extraout_var_03,iVar9);
  if (program.m_program.m_info.linkOk != false) {
    (**(code **)(lVar20 + 8))(0x84c0);
    (**(code **)(lVar20 + 0xb8))(0x8513,depthStencilTex.super_ObjectWrapper.m_object);
    (**(code **)(lVar20 + 0x1360))(0x8513,0x2801,0x2600);
    (**(code **)(lVar20 + 0x1360))(0x8513,0x2800,0x2600);
    (**(code **)(lVar20 + 0x1360))(0x8513,0x90ea,0x1901);
    dVar10 = (**(code **)(lVar20 + 0x800))();
    glu::checkError(dVar10,"Texture state setup failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fStencilTexturingTests.cpp"
                    ,0x179);
    (**(code **)(lVar20 + 0x1680))(program.m_program.m_program);
    pcVar2 = *(code **)(lVar20 + 0x14f0);
    uVar11 = (**(code **)(lVar20 + 0xb48))(program.m_program.m_program,"u_sampler");
    (*pcVar2)(uVar11,0);
    dVar10 = (**(code **)(lVar20 + 0x800))();
    glu::checkError(dVar10,"Program setup failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fStencilTexturingTests.cpp"
                    ,0x17d);
    (**(code **)(lVar20 + 0x1a00))(0,0,0x80,0x80);
    srcLevel.m_format.order = R;
    srcLevel.m_format.type = UNORM_INT32;
    srcLevel.m_size.m_data._0_8_ = srcLevel.m_size.m_data._0_8_ & 0xffffffff00000000;
    srcLevel._16_6_ = SUB86(indices,0);
    srcLevel.m_pitch.m_data[0]._2_2_ = (undefined2)((ulong)indices >> 0x30);
    glu::draw(context,program.m_program.m_program,2,vertexArrays,(PrimitiveList *)&srcLevel,
              (DrawUtilCallback *)0x0);
    lVar20 = -0xa0;
    do {
      plVar3 = (long *)(((string *)(paVar19 + -1))->_M_dataplus)._M_p;
      if (paVar19 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar3) {
        operator_delete(plVar3,paVar19->_M_allocated_capacity + 1);
      }
      paVar19 = paVar19 + -5;
      lVar20 = lVar20 + 0x50;
    } while (lVar20 != 0);
    glu::ShaderProgram::~ShaderProgram(&program);
    tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)&program,&result);
    glu::readPixels(context,0,0,(PixelBufferAccess *)&program);
    vertexArrays[0].binding.type = TYPE_LOCATION;
    vertexArrays[0].binding._4_4_ = 3;
    tcu::TextureCube::TextureCube((TextureCube *)&program,(TextureFormat *)vertexArrays,0x40);
    srcLevel.m_format.order = R;
    srcLevel.m_format.type = SNORM_INT8;
    srcLevel.m_size.m_data[0] = 0;
    srcLevel.m_size.m_data[1] = 0;
    srcLevel._16_6_ = 0;
    srcLevel.m_pitch.m_data[0]._2_2_ = 0;
    srcLevel.m_pitch.m_data[1] = CONCAT31(srcLevel.m_pitch.m_data[1]._1_3_,1);
    srcLevel.m_pitch.m_data[2]._0_2_ = 0;
    srcLevel.m_pitch.m_data[2]._2_1_ = 0;
    srcLevel.m_pitch.m_data[2]._3_1_ = 0;
    srcLevel.m_data._0_4_ = R;
    srcLevel.m_data._4_4_ = SNORM_INT8;
    glu::TextureTestUtil::ReferenceParams::ReferenceParams
              ((ReferenceParams *)vertexArrays,TEXTURETYPE_CUBE,(Sampler *)&srcLevel,LODMODE_EXACT);
    lVar20 = 0;
    do {
      positions[lVar20] = 3.08286e-44;
      lVar20 = lVar20 + 1;
    } while (lVar20 != 3);
    lVar20 = 3;
    do {
      positions[lVar20] = 2.24208e-44;
      lVar20 = lVar20 + 1;
    } while (lVar20 != 6);
    positions[6] = 0.0;
    positions[7] = 0.0;
    __dnew_1._0_4_ = 0;
    __dnew_1._4_4_ = 0x16;
    local_4b0 = 0x10;
    indices[0] = '\b';
    indices[1] = '\0';
    indices[2] = '\0';
    indices[3] = '\0';
    stack0xfffffffffffffacc = UNORM_SHORT_565;
    tcu::computeFixedPointThreshold((tcu *)&srcLevel,(IVec4 *)indices);
    positions[6] = (float)srcLevel.m_format.order;
    positions[7] = (float)srcLevel.m_format.type;
    positions[0] = 3.08286e-44;
    positions[1] = 3.08286e-44;
    positions[2] = 3.08286e-44;
    positions[3] = 7.00649e-45;
    __dnew_1._4_4_ = 0x10;
    local_4b0 = 7;
    positions[4] = 7.00649e-45;
    positions[5] = 0.0;
    if (0 < (int)((ulong)((long)texData.m_access[0].
                                super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)texData.m_access[0].
                               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333) {
      local_510 = (pointer)0x0;
      lVar20 = 0;
      do {
        lVar16 = 0;
        do {
          if (texData.m_data[lVar16].
              super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar20].m_cap != 0) {
            tcu::TextureCube::allocLevel((TextureCube *)&program,(CubeFace)lVar16,(int)lVar20);
            pPVar4 = texData.m_access[lVar16].
                     super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            srcLevel.m_format = *(TextureFormat *)(pPVar4 + lVar20);
            lVar15 = 2;
            do {
              srcLevel.m_size.m_data[lVar15 + -2] =
                   *(int *)((long)local_510 +
                           (long)((pPVar4->super_ConstPixelBufferAccess).m_size.m_data + lVar15 + -2
                                 ));
              lVar15 = lVar15 + 1;
            } while (lVar15 != 5);
            lVar15 = 5;
            do {
              srcLevel.m_size.m_data[lVar15 + -2] =
                   *(int *)((long)local_510 +
                           (long)((pPVar4->super_ConstPixelBufferAccess).m_size.m_data + lVar15 + -2
                                 ));
              lVar15 = lVar15 + 1;
            } while (lVar15 != 8);
            TVar14 = ((TextureFormat *)(pPVar4 + lVar20))[4];
            srcLevel.m_data._0_4_ = TVar14.order;
            srcLevel.m_data._4_4_ = TVar14.type;
            pcVar5 = (&program.m_program.m_info.infoLog._M_dataplus)[lVar16 * 3]._M_p;
            _indices = *(TextureFormat *)(pcVar5 + lVar20 * 0x28);
            lVar15 = 2;
            do {
              *(undefined4 *)(indices + lVar15 * 4) =
                   *(undefined4 *)((long)local_510 + (long)(pcVar5 + lVar15 * 4));
              lVar15 = lVar15 + 1;
            } while (lVar15 != 5);
            lVar15 = 5;
            do {
              *(undefined4 *)(indices + lVar15 * 4) =
                   *(undefined4 *)((long)local_510 + (long)(pcVar5 + lVar15 * 4));
              lVar15 = lVar15 + 1;
            } while (lVar15 != 8);
            local_518 = ((TextureFormat *)(pcVar5 + lVar20 * 0x28))[4];
            if (0 < texData.m_size) {
              iVar9 = 0;
              do {
                if (0 < texData.m_size) {
                  iVar17 = 0;
                  do {
                    iVar12 = tcu::ConstPixelBufferAccess::getPixStencil(&srcLevel,iVar17,iVar9,0);
                    local_558.redBits = (int)((float)iVar12 / 255.0);
                    local_558.greenBits = 0;
                    local_558.blueBits = 0;
                    local_558.alphaBits = 0x3f800000;
                    tcu::PixelBufferAccess::setPixel
                              ((PixelBufferAccess *)indices,(Vec4 *)&local_558,iVar17,iVar9,0);
                    iVar17 = iVar17 + 1;
                  } while (iVar17 < texData.m_size);
                }
                iVar9 = iVar9 + 1;
              } while (iVar9 < texData.m_size);
            }
          }
          lVar16 = lVar16 + 1;
        } while (lVar16 != 6);
        lVar20 = lVar20 + 1;
        local_510 = local_510 + 10;
      } while (lVar20 < (int)((ulong)((long)texData.m_access[0].
                                            super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)texData.m_access[0].
                                           super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                           ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                        -0x33333333);
    }
    testCtx = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    tcu::ConstPixelBufferAccess::ConstPixelBufferAccess((ConstPixelBufferAccess *)indices,&result);
    srcLevel.m_data._0_4_ = (ChannelOrder)local_1b0;
    srcLevel.m_data._4_4_ = (ChannelType)((ulong)local_1b0 >> 0x20);
    srcLevel._16_6_ = SUB86(local_1c0,0);
    srcLevel.m_pitch.m_data[0]._2_2_ = (undefined2)((ulong)local_1c0 >> 0x30);
    srcLevel.m_pitch.m_data[1] = (int)pCStack_1b8;
    srcLevel.m_pitch.m_data[2]._0_2_ = (undefined2)((ulong)pCStack_1b8 >> 0x20);
    srcLevel.m_pitch.m_data[2]._2_1_ = (undefined1)((ulong)pCStack_1b8 >> 0x30);
    srcLevel.m_pitch.m_data[2]._3_1_ = (undefined1)((ulong)pCStack_1b8 >> 0x38);
    local_558.redBits = 8;
    local_558.greenBits = 8;
    local_558.blueBits = 8;
    local_558.alphaBits = 8;
    bVar8 = glu::TextureTestUtil::verifyTextureResult
                      (testCtx,(ConstPixelBufferAccess *)indices,(TextureCubeView *)&srcLevel,
                       texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start,(ReferenceParams *)vertexArrays,
                       (LookupPrecision *)positions,(LodPrecision *)&__dnew_1,&local_558);
    description = "Image comparison failed";
    if (bVar8) {
      description = "Pass";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar8,
               description);
    tcu::TextureCube::~TextureCube((TextureCube *)&program);
    tcu::TextureLevel::~TextureLevel(&result);
    tcu::TextureCube::~TextureCube(&texData);
    glu::ObjectWrapper::~ObjectWrapper(&depthStencilTex.super_ObjectWrapper);
    glu::ObjectWrapper::~ObjectWrapper(&colorBuf.super_ObjectWrapper);
    glu::ObjectWrapper::~ObjectWrapper(&fbo.super_ObjectWrapper);
    if (texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    return STOP;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  srcLevel.m_format = (TextureFormat)(srcLevel.m_size.m_data + 2);
  srcLevel._16_6_ = 0x6c69706d6f43;
  srcLevel.m_pitch.m_data[0]._2_2_ = 0x2065;
  srcLevel.m_pitch.m_data[1] = 0x6c696166;
  srcLevel.m_pitch.m_data[2]._0_2_ = 0x6465;
  srcLevel.m_size.m_data[0] = 0xe;
  srcLevel.m_size.m_data[1] = 0;
  srcLevel.m_pitch.m_data[2]._2_1_ = 0;
  tcu::TestError::TestError(this_00,(string *)&srcLevel);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

IterateResult iterate (void)
	{
		const glu::RenderContext&	renderCtx			= m_context.getRenderContext();
		const glw::Functions&		gl					= renderCtx.getFunctions();
		const int					size				= 64;
		const int					renderWidth			= 128;
		const int					renderHeight		= 128;
		vector<float>				texCoord;
		glu::Framebuffer			fbo					(renderCtx);
		glu::Renderbuffer			colorBuf			(renderCtx);
		glu::Texture				depthStencilTex		(renderCtx);
		tcu::TextureCube			texData				(glu::mapGLInternalFormat(m_format), size);
		tcu::TextureLevel			result				(TextureFormat(TextureFormat::RGBA, TextureFormat::UNORM_INT8), renderWidth, renderHeight);

		checkDepthStencilFormatSupport(m_context, m_format);

		for (int faceNdx = 0; faceNdx < tcu::CUBEFACE_LAST; faceNdx++)
		{
			const tcu::CubeFace		face		= tcu::CubeFace(faceNdx);
			const int				stencilVal	= 42*faceNdx;

			texData.allocLevel(face, 0);
			tcu::clearStencil(texData.getLevelFace(0, face), stencilVal);
		}

		glu::TextureTestUtil::computeQuadTexCoordCube(texCoord, tcu::CUBEFACE_NEGATIVE_X, Vec2(-1.5f, -1.3f), Vec2(1.3f, 1.4f));

		gl.bindTexture(GL_TEXTURE_CUBE_MAP, *depthStencilTex);
		gl.texStorage2D(GL_TEXTURE_CUBE_MAP, 1, m_format, size, size);

		for (int faceNdx = 0; faceNdx < tcu::CUBEFACE_LAST; faceNdx++)
			glu::texSubImage2D(renderCtx, glu::getGLCubeFace(tcu::CubeFace(faceNdx)), 0, 0, 0, texData.getLevelFace(0, tcu::CubeFace(faceNdx)));

		GLU_EXPECT_NO_ERROR(gl.getError(), "Uploading texture data failed");

		gl.bindRenderbuffer(GL_RENDERBUFFER, *colorBuf);
		gl.renderbufferStorage(GL_RENDERBUFFER, GL_RGBA8, renderWidth, renderHeight);

		gl.bindFramebuffer(GL_FRAMEBUFFER, *fbo);
		gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, *colorBuf);
		checkFramebufferStatus(gl);

		blitStencilToColorCube(renderCtx, *depthStencilTex, &texCoord[0], renderWidth, renderHeight);
		glu::readPixels(renderCtx, 0, 0, result);

		{
			using namespace glu::TextureTestUtil;

			tcu::TextureCube		redTex			(TextureFormat(TextureFormat::R, TextureFormat::UNORM_INT8), size);
			const ReferenceParams	sampleParams	(TEXTURETYPE_CUBE, tcu::Sampler(tcu::Sampler::CLAMP_TO_EDGE,
																					tcu::Sampler::CLAMP_TO_EDGE,
																					tcu::Sampler::CLAMP_TO_EDGE,
																					tcu::Sampler::NEAREST,
																					tcu::Sampler::NEAREST));
			tcu::LookupPrecision	lookupPrec;
			tcu::LodPrecision		lodPrec			(tcu::LodPrecision::RULE_OPENGL);
			bool					compareOk;

			lookupPrec.colorMask		= tcu::BVec4(true, true, true, true);
			lookupPrec.colorThreshold	= tcu::computeFixedPointThreshold(IVec4(8, 8, 8, 8));
			lookupPrec.coordBits		= tcu::IVec3(22, 22, 22);
			lookupPrec.uvwBits			= tcu::IVec3(5, 5, 0);
			lodPrec.lodBits				= 7;
			lodPrec.derivateBits		= 16;

			stencilToUnorm8(texData, redTex);

			compareOk = verifyTextureResult(m_testCtx, result, redTex, &texCoord[0], sampleParams, lookupPrec, lodPrec, tcu::PixelFormat(8, 8, 8, 8));

			m_testCtx.setTestResult(compareOk ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL,
									compareOk ? "Pass"				: "Image comparison failed");
		}

		return STOP;
	}